

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O2

void agg::arc_to_bezier(double cx,double cy,double rx,double ry,double start_angle,
                       double sweep_angle,double *curve)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double px [4];
  double local_88 [4];
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  double local_28 [4];
  
  dVar5 = sweep_angle * 0.5;
  local_68 = cx;
  local_58 = rx;
  local_48 = ry;
  local_38 = cy;
  dVar6 = cos(dVar5);
  local_28[3] = sin(dVar5);
  local_88[1] = ((1.0 - dVar6) * 4.0) / 3.0;
  local_28[2] = local_28[3] - (dVar6 * local_88[1]) / local_28[3];
  local_88[1] = local_88[1] + dVar6;
  local_28[0] = -local_28[3];
  local_28[1] = -local_28[2];
  local_88[0] = dVar6;
  local_88[2] = local_88[1];
  local_88[3] = dVar6;
  dVar6 = sin(dVar5 + start_angle);
  dVar5 = cos(dVar5 + start_angle);
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
    dVar2 = *(double *)((long)local_28 + lVar4);
    dVar3 = *(double *)((long)local_88 + lVar4);
    pdVar1 = (double *)((long)curve + lVar4 * 2);
    *pdVar1 = (*(double *)((long)local_88 + lVar4) * dVar5 + -dVar2 * dVar6) * local_58 + local_68;
    pdVar1[1] = (dVar3 * dVar6 + dVar2 * dVar5) * local_48 + local_38;
  }
  return;
}

Assistant:

void arc_to_bezier(double cx, double cy, double rx, double ry, 
                       double start_angle, double sweep_angle,
                       double* curve)
    {
        double x0 = cos(sweep_angle / 2.0);
        double y0 = sin(sweep_angle / 2.0);
        double tx = (1.0 - x0) * 4.0 / 3.0;
        double ty = y0 - tx * x0 / y0;
        double px[4];
        double py[4];
        px[0] =  x0;
        py[0] = -y0;
        px[1] =  x0 + tx;
        py[1] = -ty;
        px[2] =  x0 + tx;
        py[2] =  ty;
        px[3] =  x0;
        py[3] =  y0;

        double sn = sin(start_angle + sweep_angle / 2.0);
        double cs = cos(start_angle + sweep_angle / 2.0);

        unsigned i;
        for(i = 0; i < 4; i++)
        {
            curve[i * 2]     = cx + rx * (px[i] * cs - py[i] * sn);
            curve[i * 2 + 1] = cy + ry * (px[i] * sn + py[i] * cs);
        }
    }